

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

int X509_NAME_get0_der(X509_NAME *nm,uchar **out_der,size_t *out_der_len)

{
  int iVar1;
  size_t *out_der_len_local;
  uchar **out_der_local;
  X509_NAME *nm_local;
  
  iVar1 = i2d_X509_NAME((X509_NAME *)nm,(uchar **)0x0);
  if (iVar1 < 1) {
    nm_local._4_4_ = 0;
  }
  else {
    if (out_der != (uchar **)0x0) {
      *out_der = (uchar *)nm->bytes->data;
    }
    if (out_der_len != (size_t *)0x0) {
      *out_der_len = nm->bytes->length;
    }
    nm_local._4_4_ = 1;
  }
  return nm_local._4_4_;
}

Assistant:

int X509_NAME_get0_der(X509_NAME *nm, const unsigned char **out_der,
                       size_t *out_der_len) {
  // Make sure encoding is valid
  if (i2d_X509_NAME(nm, NULL) <= 0) {
    return 0;
  }
  if (out_der != NULL) {
    *out_der = (unsigned char *)nm->bytes->data;
  }
  if (out_der_len != NULL) {
    *out_der_len = nm->bytes->length;
  }
  return 1;
}